

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb
          (cbtQuantizedBvh *this,cbtQuantizedBvhNode *currentNode,
          cbtNodeOverlapCallback *nodeCallback,unsigned_short *quantizedQueryAabbMin,
          unsigned_short *quantizedQueryAabbMax)

{
  cbtQuantizedBvhNode *pcVar1;
  cbtQuantizedBvhNode *pcVar2;
  uint uVar3;
  
  while( true ) {
    uVar3 = testQuantizedAabbAgainstQuantizedAabb
                      (quantizedQueryAabbMin,quantizedQueryAabbMax,currentNode->m_quantizedAabbMin,
                       currentNode->m_quantizedAabbMax);
    if (uVar3 == 0) {
      return;
    }
    uVar3 = currentNode->m_escapeIndexOrTriangleIndex;
    if (-1 < (int)uVar3) break;
    walkRecursiveQuantizedTreeAgainstQueryAabb
              (this,currentNode + 1,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
    pcVar2 = currentNode + 1;
    pcVar1 = currentNode + (ulong)(uint)-pcVar2->m_escapeIndexOrTriangleIndex + 1;
    currentNode = currentNode + 2;
    if (pcVar2->m_escapeIndexOrTriangleIndex < 0) {
      currentNode = pcVar1;
    }
  }
  (*nodeCallback->_vptr_cbtNodeOverlapCallback[2])
            (nodeCallback,(ulong)(uVar3 >> 0x15),(ulong)(uVar3 & 0x1fffff));
  return;
}

Assistant:

void cbtQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb(const cbtQuantizedBvhNode* currentNode, cbtNodeOverlapCallback* nodeCallback, unsigned short int* quantizedQueryAabbMin, unsigned short int* quantizedQueryAabbMax) const
{
	cbtAssert(m_useQuantization);

	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	//PCK: unsigned instead of bool
	aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, currentNode->m_quantizedAabbMin, currentNode->m_quantizedAabbMax);
	isLeafNode = currentNode->isLeafNode();

	//PCK: unsigned instead of bool
	if (aabbOverlap != 0)
	{
		if (isLeafNode)
		{
			nodeCallback->processNode(currentNode->getPartId(), currentNode->getTriangleIndex());
		}
		else
		{
			//process left and right children
			const cbtQuantizedBvhNode* leftChildNode = currentNode + 1;
			walkRecursiveQuantizedTreeAgainstQueryAabb(leftChildNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);

			const cbtQuantizedBvhNode* rightChildNode = leftChildNode->isLeafNode() ? leftChildNode + 1 : leftChildNode + leftChildNode->getEscapeIndex();
			walkRecursiveQuantizedTreeAgainstQueryAabb(rightChildNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
		}
	}
}